

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltimerquery.cpp
# Opt level: O0

QList<unsigned_long> * __thiscall
QOpenGLTimeMonitorPrivate::samples(QOpenGLTimeMonitorPrivate *this)

{
  const_reference puVar1;
  long in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  int i;
  QList<unsigned_long> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int local_3c;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RSI + 0xb8) == 0) {
    for (local_3c = 0; local_3c <= *(int *)(in_RSI + 0xc4); local_3c = local_3c + 1) {
      in_stack_ffffffffffffff98 = *(QList<unsigned_long> **)(in_RSI + 0xb0);
      puVar1 = QList<unsigned_int>::at
                         ((QList<unsigned_int> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (qsizetype)in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa4 = *puVar1;
      QList<unsigned_long>::operator[]
                ((QList<unsigned_long> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (qsizetype)in_stack_ffffffffffffff98);
      QOpenGLQueryHelper::glGetQueryObjectui64v
                ((QOpenGLQueryHelper *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                 ,(GLuint)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                 (GLenum)in_stack_ffffffffffffff98,(GLuint64 *)0x1c89b9);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_RDI,in_stack_ffffffffffffffa4,(char *)in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (local_28,
               "QOpenGLTimeMonitor::samples() requires OpenGL >=3.3\nor OpenGL 3.2 and GL_ARB_timer_query"
              );
  }
  QList<unsigned_long>::QList
            ((QList<unsigned_long> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<unsigned_long> *)in_RDI;
}

Assistant:

QList<GLuint64> QOpenGLTimeMonitorPrivate::samples() const
{
    // For the Core and ARB options just ask for the timestamp for each timer query.
    // For the EXT implementation we cannot obtain timestamps so we defer any result
    // collection to the intervals() function
    if (!ext) {
        for (int i = 0; i <= currentSample; ++i)
            core->glGetQueryObjectui64v(timers.at(i), GL_QUERY_RESULT, &timeSamples[i]);
    } else {
        qWarning("QOpenGLTimeMonitor::samples() requires OpenGL >=3.3\n"
                 "or OpenGL 3.2 and GL_ARB_timer_query");
    }
    return timeSamples;
}